

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quuid.cpp
# Opt level: O2

QDebug operator<<(QDebug dbg,QUuid *id)

{
  long lVar1;
  QDebug *pQVar2;
  QUuid *in_RDX;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> QStack_48;
  QDebugStateSaver saver;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  saver.d._M_t.
  super___uniq_ptr_impl<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>._M_t
  .super__Tuple_impl<0UL,_QDebugStateSaverPrivate_*,_std::default_delete<QDebugStateSaverPrivate>_>.
  super__Head_base<0UL,_QDebugStateSaverPrivate_*,_false>._M_head_impl =
       (unique_ptr<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>)
       &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver(&saver,(QDebug *)id);
  *(undefined1 *)(*(long *)id + 0x30) = 0;
  pQVar2 = QDebug::operator<<((QDebug *)id,"QUuid(");
  QUuid::toString((QString *)&QStack_48,in_RDX,WithBraces);
  pQVar2 = QDebug::operator<<(pQVar2,(QString *)&QStack_48);
  QDebug::operator<<(pQVar2,')');
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_48);
  id->data1 = 0;
  id->data2 = 0;
  id->data3 = 0;
  ((dbg.stream)->ts)._vptr_QTextStream = *(_func_int ***)id;
  QDebugStateSaver::~QDebugStateSaver(&saver);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QDebug)dbg.stream;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug dbg, const QUuid &id)
{
    QDebugStateSaver saver(dbg);
    dbg.nospace() << "QUuid(" << id.toString() << ')';
    return dbg;
}